

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_noncentral_absolute_pose.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pMVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *pDVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar14;
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar15;
  timeval tVar16;
  timeval tic;
  timeval toc;
  translation_t t_perturbed;
  vector<int,_std::allocator<int>_> camCorrespondences;
  points_t points;
  bearingVectors_t bearingVectors;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> indices10;
  vector<int,_std::allocator<int>_> indices6;
  transformation_t nonlinear_transformation;
  transformation_t gpnp_transformation;
  NoncentralAbsoluteAdapter adapter;
  rotation_t R_perturbed;
  rotation_t rotation;
  transformation_t nonlinear_transformation_10;
  transformation_t gpnp_transformation_6;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *local_4b8;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *local_4b0;
  timeval local_4a8;
  pointer local_498;
  timeval local_490;
  translation_t local_480;
  vector<int,_std::allocator<int>_> local_460;
  points_t local_440;
  bearingVectors_t local_420;
  __suseconds_t local_408;
  __time_t local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  rotations_t local_3e0;
  translations_t local_3c0;
  Vector3d local_3a8;
  DenseStorage<double,__1,__1,__1,_0> local_390;
  vector<int,_std::allocator<int>_> local_370;
  vector<int,_std::allocator<int>_> local_358;
  transformations_t local_340;
  double dStack_328;
  double dStack_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double dStack_300;
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  transformations_t local_2c0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  NoncentralAbsoluteAdapter local_260;
  rotation_t local_1d0;
  Matrix3d local_188;
  transformation_t local_140;
  transformation_t local_e0;
  
  opengv::initializeRandomSeed();
  opengv::generateRandomTranslation(&local_3a8,2.0);
  opengv::generateRandomRotation(&local_188,0.5);
  local_3c0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,&local_3c0,&local_3e0);
  local_420.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_460.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_420.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_420.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_440.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_460.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_460.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_390.m_cols = 0;
  local_390.m_data = (double *)0x0;
  local_390.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_390,300,3,100);
  opengv::generateRandom2D3DCorrespondences
            (&local_3a8,&local_188,&local_3c0,&local_3e0,100,0.0,0.0,&local_420,&local_440,
             &local_460,(MatrixXd *)&local_390);
  opengv::printExperimentCharacteristics(&local_3a8,&local_188,0.0,0.0);
  opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
            (&local_260,&local_420,&local_460,&local_440,&local_3c0,&local_3e0,&local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running Kneip\'s GP3P (using first three correspondences/",0x38)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_4b0 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0;
  gettimeofday(&local_4a8,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  do {
    pDVar5 = local_4b0;
    opengv::absolute_pose::gp3p(&local_2c0,&local_260.super_AbsoluteAdapterBase,0,1,2);
    pMVar1 = local_2c0.
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4b0 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                local_2c0.
                super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pDVar5 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
      free(*(void **)(pDVar5 + -8));
      if ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
          local_2c0.
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
        free(*(void **)((long)local_2c0.
                              super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + -8));
      }
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  gettimeofday(&local_490,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  tVar16 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running gpnp over all correspondences",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar6._0_8_ = (double)tVar15.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  auVar10._0_8_ = (double)tVar16.tv_usec;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar10,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_3e8 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_4a8,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  do {
    opengv::absolute_pose::gpnp(&local_e0,&local_260.super_AbsoluteAdapterBase);
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[0];
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[1];
    local_2c0.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[2];
    lVar4 = lVar4 + -1;
    dStack_280 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[8];
    dStack_278 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[9];
    dStack_270 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[10];
    dStack_268 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0xb];
    dStack_2a8 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[3];
    dStack_2a0 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[4];
    dStack_298 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[5];
    dStack_290 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[6];
    dStack_288 = local_e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[7];
  } while (lVar4 != 0);
  gettimeofday(&local_490,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  tVar16 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running gpnp over 6 correspondences",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getNindices(&local_358,6);
  opengv::absolute_pose::gpnp(&local_e0,&local_260.super_AbsoluteAdapterBase,&local_358);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running upnp over all correspondences",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar7._0_8_ = (double)tVar15.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = (double)tVar16.tv_usec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar11,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_3f0 = auVar6._0_8_ / 50.0;
  local_4b8 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0;
  gettimeofday(&local_4a8,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  do {
    pDVar5 = local_4b8;
    opengv::absolute_pose::upnp(&local_340,&local_260.super_AbsoluteAdapterBase);
    local_498 = local_340.
                super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_4b8 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                local_340.
                super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pDVar5 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
      free(*(void **)(pDVar5 + -8));
      if ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
          local_340.
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
        free(*(void **)((long)local_340.
                              super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + -8));
      }
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  gettimeofday(&local_490,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  tVar16 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_3a8,&local_188,&local_480,&local_1d0,0.1);
  auVar8._0_8_ = (double)tVar15.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = (double)tVar16.tv_usec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar12,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_3f8 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_4a8,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  do {
    local_260.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    local_260.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_260.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    local_260.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    opengv::absolute_pose::optimize_nonlinear(&local_140,&local_260.super_AbsoluteAdapterBase);
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[0];
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[1];
    local_340.
    super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                  m_data.array[2];
    lVar4 = lVar4 + -1;
    dStack_300 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[8];
    dStack_2f8 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[9];
    dStack_2f0 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[10];
    dStack_2e8 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0xb];
    dStack_328 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[3];
    dStack_320 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[4];
    dStack_318 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[5];
    dStack_310 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[6];
    dStack_308 = local_140.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[7];
  } while (lVar4 != 0);
  gettimeofday(&local_490,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  local_400 = tVar15.tv_sec;
  tVar15 = timeval_minus((timeval *)&local_490,(timeval *)&local_4a8);
  local_408 = tVar15.tv_usec;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose and ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performing nonlinear optimization with 10 correspondences",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getNindices(&local_370,10);
  opengv::getPerturbedPose(&local_3a8,&local_188,&local_480,&local_1d0,0.1);
  local_260.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_260.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_260.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_260.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  opengv::absolute_pose::optimize_nonlinear
            (&local_140,&local_260.super_AbsoluteAdapterBase,&local_370);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from gp3p algorithm:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)pMVar1 - (long)local_4b0 != 0) {
    lVar4 = ((long)pMVar1 - (long)local_4b0 >> 5) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    pDVar5 = local_4b0;
    do {
      poVar2 = Eigen::operator<<((ostream *)&std::cout,pDVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar3 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      pDVar5 = pDVar5 + 0x60;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from gpnp algorithm:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_2c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from gpnp algorithm with only 6 correspondences:",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from upnp algorithm:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_498 = (pointer)((long)local_498 - (long)local_4b8);
  if (local_498 != (pointer)0x0) {
    lVar4 = ((long)local_498 >> 5) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    pDVar5 = local_4b8;
    do {
      poVar2 = Eigen::operator<<((ostream *)&std::cout,pDVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar3 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      pDVar5 = pDVar5 + 0x60;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm:",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_340);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm with only 10 correspondences:",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_140);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from gp3p algorithm: ",0x1d);
  poVar2 = std::ostream::_M_insert<double>(local_3e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from gpnp algorithm: ",0x1d);
  poVar2 = std::ostream::_M_insert<double>(local_3f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from upnp algorithm: ",0x1d);
  poVar2 = std::ostream::_M_insert<double>(local_3f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar14 = extraout_XMM1_Qb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from nonlinear algorithm: ",0x22);
  auVar9._0_8_ = (double)local_400;
  auVar9._8_8_ = uVar14;
  auVar13._0_8_ = (double)local_408;
  auVar13._8_8_ = uVar14;
  auVar6 = vfmadd132sd_fma(auVar13,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar2 = std::ostream::_M_insert<double>(auVar6._0_8_ / 50.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4b8 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
    free(*(void **)((pointer)local_4b8 + -8));
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4b0 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
    free(*(void **)((pointer)local_4b0 + -8));
  }
  opengv::absolute_pose::NoncentralAbsoluteAdapter::~NoncentralAbsoluteAdapter(&local_260);
  if (local_390.m_data != (double *)0x0) {
    free((void *)local_390.m_data[-1]);
  }
  if (local_460.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_460.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_440.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_440.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_420.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_420.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_3e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_3e0.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (local_3c0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_3c0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteAdapter adapter(
      bearingVectors,
      camCorrespondences,
      points,
      camOffsets,
      camRotations,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's GP3P (using first three correspondences/";
  std::cout << std::endl;
  transformations_t gp3p_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gp3p_transformations = absolute_pose::gp3p(adapter);
  gettimeofday( &toc, 0 );
  double gp3p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over all correspondences" << std::endl;
  transformation_t gpnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gpnp_transformation = absolute_pose::gpnp(adapter);
  gettimeofday( &toc, 0 );
  double gpnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t gpnp_transformation_6 =
      absolute_pose::gpnp(adapter,indices6);
  
  std::cout << "running upnp over all correspondences" << std::endl;
  transformations_t upnp_transformations;
  gettimeofday( &tic, 0 );
  for( size_t i = 0; i < iterations; i++ )
    upnp_transformations = absolute_pose::upnp(adapter);
  gettimeofday( &toc, 0);
  double upnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;
  
  //std::cout << "running upnp over 6 correspondences" << std::endl;
  //transformations_t upnp_transformations_6 =
  //    absolute_pose::upnp(adapter,indices6);

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from gp3p algorithm:" << std::endl;
  for(size_t i = 0; i < gp3p_transformations.size(); i++)
    std::cout << gp3p_transformations[i] << std::endl << std::endl;
  std::cout << "results from gpnp algorithm:" << std::endl;
  std::cout << gpnp_transformation << std::endl << std::endl;
  std::cout << "results from gpnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << gpnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from upnp algorithm:" << std::endl;
  for(size_t i = 0; i < upnp_transformations.size(); i++)
    std::cout << upnp_transformations[i] << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from gp3p algorithm: ";
  std::cout << gp3p_time << std::endl;
  std::cout << "timings from gpnp algorithm: ";
  std::cout << gpnp_time << std::endl;
  std::cout << "timings from upnp algorithm: ";
  std::cout << upnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}